

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O0

void write_strings_cb(Fl_Widget *param_1,void *param_2)

{
  FILE *__stream;
  char cVar1;
  int iVar2;
  char *pcVar3;
  int *piVar4;
  char local_818 [4];
  int x;
  char sname [2048];
  void *param_2_local;
  Fl_Widget *param_1_local;
  
  sname._2040_8_ = param_2;
  if ((filename != (char *)0x0) || (save_cb((Fl_Widget *)0x0,(void *)0x0), filename != (char *)0x0))
  {
    pcVar3 = fl_filename_name(filename);
    fl_strlcpy(local_818,pcVar3,0x800);
    fl_filename_setext(local_818,0x800,write_strings_cb::exts[i18n_type]);
    if (batch_mode == 0) {
      goto_source_dir();
    }
    iVar2 = write_strings(local_818);
    if (batch_mode == 0) {
      leave_source_dir();
    }
    __stream = _stderr;
    if (batch_mode == 0) {
      if (iVar2 == 0) {
        cVar1 = Fl_Button::value((Fl_Button *)completion_button);
        if (cVar1 != '\0') {
          fl_message("Wrote %s",local_818);
        }
      }
      else {
        piVar4 = __errno_location();
        pcVar3 = strerror(*piVar4);
        fl_message("Can\'t write %s: %s",local_818,pcVar3);
      }
    }
    else if (iVar2 != 0) {
      piVar4 = __errno_location();
      pcVar3 = strerror(*piVar4);
      fprintf(__stream,"%s : %s\n",local_818,pcVar3);
      exit(1);
    }
  }
  return;
}

Assistant:

void write_strings_cb(Fl_Widget *, void *) {
  static const char *exts[] = { ".txt", ".po", ".msg" };
  if (!filename) {
    save_cb(0,0);
    if (!filename) return;
  }
  char sname[FL_PATH_MAX];
  strlcpy(sname, fl_filename_name(filename), sizeof(sname));
  fl_filename_setext(sname, sizeof(sname), exts[i18n_type]);
  if (!batch_mode) goto_source_dir();
  int x = write_strings(sname);
  if (!batch_mode) leave_source_dir();
  if (batch_mode) {
    if (x) {fprintf(stderr,"%s : %s\n",sname,strerror(errno)); exit(1);}
  } else {
    if (x) {
      fl_message("Can't write %s: %s", sname, strerror(errno));
    } else if (completion_button->value()) {
      fl_message("Wrote %s", sname);
    }
  }
}